

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall BuildTestMissingInput::Run(BuildTestMissingInput *this)

{
  Test *pTVar1;
  bool condition;
  Node *pNVar2;
  string err;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"in1",&local_59);
  BuildTest::Dirty(&this->super_BuildTest,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pTVar1 = g_current_test;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"cat1",&local_59);
  pNVar2 = Builder::AddTarget(&(this->super_BuildTest).builder_,&local_58,&local_38);
  testing::Test::Check
            (pTVar1,pNVar2 == (Node *)0x0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x37e,"builder_.AddTarget(\"cat1\", &err)");
  std::__cxx11::string::~string((string *)&local_58);
  pTVar1 = g_current_test;
  condition = std::operator==("\'in1\', needed by \'cat1\', missing and no known rule to make it",
                              &local_38);
  testing::Test::Check
            (pTVar1,condition,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x380,"\"\'in1\', needed by \'cat1\', missing and no known rule to make it\" == err");
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

TEST_F(BuildTest, MissingInput) {
  // Input is referenced by build file, but no rule for it.
  string err;
  Dirty("in1");
  EXPECT_FALSE(builder_.AddTarget("cat1", &err));
  EXPECT_EQ("'in1', needed by 'cat1', missing and no known rule to make it",
            err);
}